

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int insert_between(ll_head *q_head,ll_elem *n,ll_elem *p,ll_elem *s)

{
  int iVar1;
  ll_head *plVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  ll_elem *plVar5;
  ulong uVar6;
  bool bVar7;
  ulong local_e0;
  uintptr_t tmp;
  ll_elem *plStack_50;
  int cas;
  ll_elem *old;
  ll_elem *ps_;
  ll_elem *ps;
  ll_elem *q;
  ll_elem *s_local;
  ll_elem *p_local;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  ps_ = (ll_elem *)0x0;
  ps = &q_head->q;
  q = s;
  s_local = p;
  p_local = n;
  n_local = &q_head->q;
  plVar2 = (ll_head *)ptr_clear(&q_head->q);
  plVar5 = p_local;
  if (q_head != plVar2) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c7,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar3 = ptr_clear(p_local);
  plVar4 = s_local;
  if (plVar5 != plVar3) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c8,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar3 = ptr_clear(s_local);
  plVar5 = q;
  if (plVar4 != plVar3) {
    __assert_fail("p == ptr_clear(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c9,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar4 = ptr_clear(q);
  if (plVar5 != plVar4) {
    __assert_fail("s == ptr_clear(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ca,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar5 = ptr_clear((ll_elem *)p_local->pred);
  if (plVar5 != (ll_elem *)0x0) {
    __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred, memory_order_relaxed)) == NULL"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cd
                  ,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (p_local->succ != 2) {
    __assert_fail("atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ce,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (p_local->refcnt == 0) {
    __assert_fail("atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cf,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  do {
  } while (p_local->pred != 0);
  deref_acquire(s_local,1);
  deref_acquire(q,1);
  plStack_50 = (ll_elem *)0x2;
  iVar1 = ptr_cas(&p_local->succ,&stack0xffffffffffffffb0,(ll_elem *)((ulong)q | 2));
  if (iVar1 != 0) {
    ptr_clear_deref(&p_local->succ);
    plStack_50 = (ll_elem *)0x0;
    iVar1 = ptr_cas(&p_local->pred,&stack0xffffffffffffffb0,s_local);
    if (iVar1 == 0) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x1e8,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    ptr_clear_deref(&p_local->pred);
    ps_ = deref(&s_local->succ);
    plVar5 = ptr_clear(ps_);
    plVar4 = ptr_clear(q);
    if ((plVar5 == plVar4) && (iVar1 = deleted(s_local), iVar1 == 0)) {
      old = ps_;
      iVar1 = ptr_cas(&s_local->succ,&old,p_local);
      if (iVar1 != 0) {
        iVar1 = deleted(s_local);
        if (iVar1 == 0) {
          deref_acquire(p_local,1);
          ptr_clear_deref(&s_local->succ);
          deref_release((ll_head *)n_local,ps_,2);
          plVar5 = n_local;
          ps_ = (ll_elem *)0x0;
          plVar4 = pred((ll_head *)n_local,q);
          deref_release((ll_head *)plVar5,plVar4,1);
          LOCK();
          n_local[1].succ = n_local[1].succ + 1;
          UNLOCK();
          local_e0 = p_local->succ;
          do {
            LOCK();
            uVar6 = p_local->succ;
            bVar7 = local_e0 == uVar6;
            if (bVar7) {
              p_local->succ = local_e0 & 0xfffffffffffffffd;
              uVar6 = local_e0;
            }
            UNLOCK();
            local_e0 = uVar6;
          } while (!bVar7);
          return 1;
        }
        LOCK();
        uVar6 = s_local->succ;
        s_local->succ = (elem_ptr_t)old;
        UNLOCK();
        if ((ll_elem *)(uVar6 & 0xfffffffffffffffc) != p_local) {
          __assert_fail("(tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x209,
                        "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                       );
        }
        if ((uVar6 & 1) == 0) {
          __assert_fail("tmp & DEREF",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x20a,
                        "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                       );
        }
      }
    }
    plStack_50 = (ll_elem *)((ulong)q | 2);
    iVar1 = ptr_cas(&p_local->succ,&stack0xffffffffffffffb0,(ll_elem *)0x2);
    if (iVar1 == 0) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x223,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    ptr_clear_deref(&p_local->succ);
    plStack_50 = s_local;
    iVar1 = ptr_cas(&p_local->pred,&stack0xffffffffffffffb0,(ll_elem *)0x0);
    if (iVar1 != 0) {
      ptr_clear_deref(&p_local->pred);
      deref_release((ll_head *)n_local,s_local,1);
      deref_release((ll_head *)n_local,q,1);
      deref_release((ll_head *)n_local,ps_,1);
      return 0;
    }
    __assert_fail("cas","/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                  0x229,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  __assert_fail("cas","/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                0x1e3,
                "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
               );
}

Assistant:

static int
insert_between(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *p, struct ll_elem *s)
{
	struct ll_elem	*q, *ps = NULL, *ps_, *old;
	int		 cas;

	q = &q_head->q;
	/* Check arguments. */
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(p == ptr_clear(p));
	assert(s == ptr_clear(s));
	/* Check initial state of n. */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed)) == NULL);
	assert(atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED);
	assert(atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0);
	/*
	 * Give unlink_release() time to update n->pred.
	 * XXX try and make this an aid function?
	 */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) != 0)
		SPINWAIT();

	/*
	 * Assign n->pred, n->succ.
	 *
	 * We add a flag to s, to prevent deletion operations from starting
	 * before we are ready.
	 */
	deref_acquire(p, 1);	/* Because n->pred = p. */
	deref_acquire(s, 1);	/* Because n->succ = s. */

	old = (struct ll_elem*)FLAGGED;
	cas = ptr_cas(&n->succ, &old,
	    (struct ll_elem*)((uintptr_t)s | FLAGGED));
	assert(cas);
	ptr_clear_deref(&n->succ);

	old = NULL;
	cas = ptr_cas(&n->pred, &old, p);
	assert(cas);
	ptr_clear_deref(&n->pred);

	/* Load bits in p->succ. */
	ps = deref(&p->succ);
	if (ptr_clear(ps) != ptr_clear(s) || deleted(p))
		goto fail;

	/* Exchange p->succ from s to n. */
	ps_ = ps;
	if (!ptr_cas(&p->succ, &ps_, n))
		goto fail;
	/*
	 * If p is not deleted at this moment, the link is succesful
	 * (since a non-deleted p means p is reachable from q and
	 * our update changed n to be reachable from p,
	 * hence it's reachable from q).
	 *
	 * Note that we hold the DEREF on ps->succ, so it cannot change.
	 *
	 * Also, note that we do not care if s has the deleted bit set:
	 * if it is being deleted, its deletor would have to update
	 * p->succ as well; we simply won the race to do that.
	 */
	if (deleted(p)) {
		uintptr_t	 tmp;

		/*
		 * Restore old value, note that this operation also clears
		 * the deref bit, since ps_ will not have that set.
		 */
		tmp = atomic_exchange_explicit(&p->succ, (uintptr_t)ps_,
		    memory_order_release);
		assert((tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n);
		assert(tmp & DEREF);
		goto fail;
	}

	/* Update succesful.  Update deref counter on n and release p->succ. */
	deref_acquire(n, 1);
	ptr_clear_deref(&p->succ);
	/* Forget ps. */
	deref_release(q_head, ps, 2);	/* Once for ps, once for p->succ. */
	ps = NULL;

	/* Fix pred pointer of s. */
	deref_release(q_head, pred(q_head, s), 1);

	/* Update list size. */
	atomic_fetch_add_explicit(&q_head->size, 1, memory_order_relaxed);
	/* Clear delete block. */
	atomic_fetch_and_explicit(&n->succ, ~FLAGGED, memory_order_release);

	return 1;

fail:
	/* Undo setting n->succ. */
	old = (struct ll_elem*)((uintptr_t)s | FLAGGED);
	cas = ptr_cas(&n->succ, &old, (struct ll_elem*)FLAGGED);
	assert(cas);
	ptr_clear_deref(&n->succ);

	/* Undo setting n->pred. */
	old = p;
	cas = ptr_cas(&n->pred, &old, NULL);
	assert(cas);
	ptr_clear_deref(&n->pred);

	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, ps, 1);
	return 0;
}